

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_list_to_uvector_op(sexp ctx,sexp self,sexp_sint_t n,sexp etype,sexp ls)

{
  byte *pbVar1;
  sexp b;
  undefined1 x [16];
  undefined1 x_00 [16];
  char cVar2;
  byte bVar3;
  uchar uVar4;
  unsigned_short uVar5;
  int iVar6;
  sexp psVar7;
  sexp psVar8;
  anon_union_24768_35_b8e82fc1_for_value *paVar9;
  sexp psVar10;
  sexp_sint_t n_00;
  sexp_sint_t n_01;
  ulong n_02;
  long lVar11;
  uint uVar12;
  sexp psVar13;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  sexp res;
  sexp ctx_00;
  sexp_gc_var_t local_40;
  
  if (((ulong)etype & 1) == 0) {
    psVar7 = sexp_type_exception(ctx,self,2,etype);
    return psVar7;
  }
  psVar7 = self;
  psVar8 = ctx;
  sexp_listp_op(ctx,self,n,ls);
  local_40.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  uVar15 = (long)etype >> 1;
  local_40.var = (sexp_conflict *)&stack0xffffffffffffffa8;
  psVar7 = sexp_length_op(psVar8,psVar7,n_00,ls);
  if (uVar15 == 3) {
    psVar8 = (sexp)0x0;
    psVar7 = sexp_make_bytes_op(ctx,(sexp)0x0,n_01,psVar7,(sexp)&DAT_0000043e);
  }
  else {
    psVar8 = (sexp)0x0;
    psVar7 = sexp_make_uvector_op(ctx,(sexp)0x0,n_01,etype,psVar7);
  }
  if ((0x154UL >> (uVar15 & 0x3f) & 1) == 0) {
    if ((0x1b00UL >> (uVar15 & 0x3f) & 1) == 0) {
      psVar13 = (sexp)~(-1L << (""[uVar15] & 0x3f));
    }
    else {
      psVar13 = (sexp)&DAT_ffffffffffffffff;
    }
    uVar14 = 0;
  }
  else {
    uVar14 = -1L << (""[uVar15] - 1 & 0x3f);
    psVar13 = (sexp)~uVar14;
  }
  if (((ulong)ls & 3) == 0) {
    n_02 = 0x3feL >> ((byte)uVar15 & 0x3f);
    psVar10 = ls;
    do {
      ctx_00 = ctx;
      if (psVar10->tag != 6) break;
      b = (psVar10->value).type.name;
      if ((n_02 & 1) != 0) {
        psVar8 = (sexp)((uint)b & 3 | uVar14);
        if ((psVar8 == (sexp)0x0) && (b->tag == 0xc)) {
          if ('\0' < (b->value).flonum_bits[0]) {
LAB_00115d82:
            if (((ulong)b & 2) == 0) {
              if (b->tag == 0xc) {
                psVar8 = (sexp)((long)(b->value).flonum_bits[0] * (b->value).uvector.length);
                if (-1 < (long)psVar8) {
LAB_00115daf:
                  psVar8 = (b->value).type.slots;
                  goto LAB_00115db3;
                }
              }
              else if (b->tag == 0xc) goto LAB_00115daf;
            }
            goto LAB_00115db8;
          }
        }
        else {
          if (((ulong)b & 1) == 0) {
            if ((((ulong)b & 2) != 0) || (b->tag != 0xc)) goto LAB_00115dcc;
            psVar8 = (sexp)((long)(b->value).flonum_bits[0] * (b->value).uvector.length);
          }
          else {
            psVar8 = (sexp)((long)b >> 1);
          }
          if ((long)uVar14 <= (long)psVar8) {
            if (((ulong)b & 1) == 0) goto LAB_00115d82;
            if ((long)b < 0) goto LAB_00115db8;
            psVar8 = (sexp)((ulong)b >> 1);
LAB_00115db3:
            if (psVar8 <= psVar13) goto LAB_00115db8;
          }
        }
LAB_00115dcc:
        psVar7 = sexp_cons_op(ctx,psVar8,n_02,(sexp)&DAT_0000003e,(sexp)&DAT_0000003e);
        x._8_8_ = ctx_00;
        x._0_8_ = psVar7;
        psVar8 = sexp_make_integer(ctx,(sexp_lsint_t)x);
        (psVar7->value).type.name = psVar8;
        x_00._8_8_ = ctx_00;
        x_00._0_8_ = psVar7;
        psVar8 = sexp_make_integer(ctx,(sexp_lsint_t)x_00);
        (psVar7->value).type.cpl = psVar8;
        psVar7 = sexp_list2(ctx,psVar7,b);
        psVar7 = sexp_xtype_exception(ctx,self,"invalid uniform vector value",psVar7);
        break;
      }
      if (((ulong)etype & 0xfffffffffffffffc) == 0x18) {
        if ((((ulong)b & 1) == 0) &&
           ((((ulong)b & 2) != 0 ||
            (uVar12 = b->tag - 0xb, psVar8 = (sexp)(ulong)uVar12, 3 < uVar12)))) goto LAB_00115dcc;
      }
      else if ((((ulong)b & 1) == 0) &&
              ((((ulong)b & 2) != 0 ||
               (uVar12 = b->tag - 0xb, psVar8 = (sexp)(ulong)uVar12, 2 < uVar12))))
      goto LAB_00115dcc;
LAB_00115db8:
      psVar10 = (psVar10->value).type.cpl;
    } while (((ulong)psVar10 & 3) == 0);
    if (((ulong)psVar7 & 3) == 0) {
      if (psVar7->tag == 0x13 || ((ulong)ls & 3) != 0) goto LAB_00116146;
    }
    else if (((ulong)ls & 3) != 0) goto LAB_00116146;
    lVar11 = 0;
    uVar14 = 0;
    do {
      if (ls->tag != 6) break;
      switch(uVar15) {
      case 1:
        bVar3 = '\x01' << ((byte)uVar14 & 7);
        if ((ls->value).type.name < (sexp)0x2) {
          pbVar1 = (byte *)((((psVar7->value).type.name)->value).flonum_bits + (uVar14 >> 3) + 8);
          *pbVar1 = *pbVar1 & ~bVar3;
        }
        else {
          pbVar1 = (byte *)((((psVar7->value).type.name)->value).flonum_bits + (uVar14 >> 3) + 8);
          *pbVar1 = *pbVar1 | bVar3;
        }
        break;
      case 2:
        cVar2 = (char)(*(uint *)&ls->value >> 1);
        psVar8 = (psVar7->value).type.name;
        goto LAB_0011601d;
      case 3:
        cVar2 = (char)(*(uint *)&ls->value >> 1);
        psVar8 = psVar7;
LAB_0011601d:
        (psVar8->value).flonum_bits[uVar14 + 8] = cVar2;
        break;
      case 4:
      case 5:
        *(short *)((long)&((psVar7->value).type.name)->value + uVar14 * 2 + 8) =
             (short)(*(uint *)&ls->value >> 1);
        break;
      case 6:
        psVar8 = (ls->value).type.name;
        if (((ulong)psVar8 & 1) == 0) {
          if ((((ulong)psVar8 & 2) == 0) && (psVar8->tag == 0xc)) {
            iVar6 = (int)(psVar8->value).flonum_bits[0] * (int)(psVar8->value).uvector.length;
          }
          else {
LAB_00116107:
            iVar6 = 0;
          }
        }
        else {
LAB_001160b8:
          iVar6 = (int)((long)psVar8 >> 1);
        }
        goto LAB_00116109;
      case 7:
        psVar8 = (ls->value).type.name;
        if (((ulong)psVar8 & 1) != 0) goto LAB_001160b8;
        if ((((ulong)psVar8 & 2) != 0) || (psVar8->tag != 0xc)) goto LAB_00116107;
        iVar6 = (int)(psVar8->value).uvector.length;
LAB_00116109:
        *(int *)((long)&((psVar7->value).type.name)->value + uVar14 * 4 + 8) = iVar6;
        break;
      case 8:
        psVar8 = (ls->value).type.name;
        if (((ulong)psVar8 & 1) == 0) {
          if ((((ulong)psVar8 & 2) == 0) && (psVar8->tag == 0xc)) {
            psVar8 = (sexp)((long)(psVar8->value).flonum_bits[0] * (psVar8->value).uvector.length);
          }
          else {
LAB_001160f6:
            psVar8 = (sexp)0x0;
          }
        }
        else {
LAB_001160f1:
          psVar8 = (sexp)((long)psVar8 >> 1);
        }
        goto LAB_001160f8;
      case 9:
        psVar8 = (ls->value).type.name;
        if (((ulong)psVar8 & 1) != 0) goto LAB_001160f1;
        if ((((ulong)psVar8 & 2) != 0) || (psVar8->tag != 0xc)) goto LAB_001160f6;
        psVar8 = (psVar8->value).type.slots;
LAB_001160f8:
        *(sexp *)((long)&((psVar7->value).type.name)->value + uVar14 * 8 + 8) = psVar8;
        break;
      case 10:
        dVar16 = sexp_to_double(ctx,(ls->value).type.name);
        *(float *)((long)&((psVar7->value).type.name)->value + uVar14 * 4 + 8) = (float)dVar16;
        break;
      case 0xb:
        dVar16 = sexp_to_double(ctx,(ls->value).type.name);
        *(double *)((long)&((psVar7->value).type.name)->value + uVar14 * 8 + 8) = dVar16;
        break;
      case 0xc:
        psVar8 = (ls->value).type.name;
        if (((ulong)psVar8 & 3) == 0) {
          paVar9 = &psVar8->value;
          if (psVar8->tag != 0xe) {
            paVar9 = &ls->value;
          }
          psVar8 = (paVar9->type).name;
        }
        ctx = ctx_00;
        dVar16 = sexp_to_double(ctx_00,psVar8);
        *(float *)((long)&((psVar7->value).type.name)->value + uVar14 * 8 + 8) = (float)dVar16;
        psVar8 = (ls->value).type.name;
        psVar13 = (sexp)&DAT_00000001;
        if ((((ulong)psVar8 & 3) == 0) && (psVar8->tag == 0xe)) {
          psVar13 = (psVar8->value).type.cpl;
        }
        ctx_00 = ctx;
        dVar16 = sexp_to_double(ctx,psVar13);
        *(float *)((long)&((psVar7->value).type.name)->value + uVar14 * 8 + 0xc) = (float)dVar16;
        break;
      case 0xd:
        psVar8 = (ls->value).type.name;
        if (((ulong)psVar8 & 3) == 0) {
          paVar9 = &psVar8->value;
          if (psVar8->tag != 0xe) {
            paVar9 = &ls->value;
          }
          psVar8 = (paVar9->type).name;
        }
        ctx = ctx_00;
        dVar16 = sexp_to_double(ctx_00,psVar8);
        *(double *)((long)&((psVar7->value).type.name)->value + lVar11 + 8) = dVar16;
        psVar8 = (ls->value).type.name;
        psVar13 = (sexp)&DAT_00000001;
        if ((((ulong)psVar8 & 3) == 0) && (psVar8->tag == 0xe)) {
          psVar13 = (psVar8->value).type.cpl;
        }
        ctx_00 = ctx;
        dVar16 = sexp_to_double(ctx,psVar13);
        *(double *)((long)&((psVar7->value).type.name)->value + lVar11 + 0x10) = dVar16;
        break;
      case 0xe:
        dVar16 = sexp_to_double(ctx,(ls->value).type.name);
        uVar4 = sexp_double_to_quarter(dVar16);
        (((psVar7->value).type.name)->value).flonum_bits[uVar14 + 8] = uVar4;
        break;
      case 0xf:
        dVar16 = sexp_to_double(ctx,(ls->value).type.name);
        uVar5 = sexp_double_to_half(dVar16);
        *(unsigned_short *)((long)&((psVar7->value).type.name)->value + uVar14 * 2 + 8) = uVar5;
      }
      ls = (ls->value).type.cpl;
      uVar14 = uVar14 + 1;
      lVar11 = lVar11 + 0x10;
    } while (((ulong)ls & 3) == 0);
  }
LAB_00116146:
  (ctx->value).context.saves = local_40.next;
  return psVar7;
}

Assistant:

sexp sexp_list_to_uvector_op(sexp ctx, sexp self, sexp_sint_t n, sexp etype, sexp ls) {
  long et, i;
  long long min;
  unsigned long long max;
  sexp ls2, tmp;
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, etype);
  sexp_gc_var1(res);
  if (!sexp_listp(ctx, ls)) {
    res = sexp_exceptionp(ls) ? ls
      : sexp_xtype_exception(ctx, self, "list->uvector expected a list", ls);
  } else {
    sexp_gc_preserve1(ctx, res);
    et = sexp_unbox_fixnum(etype);
    res = et == SEXP_U8 ? sexp_make_bytes(ctx, sexp_length(ctx, ls), SEXP_VOID) : sexp_make_uvector(ctx, etype, sexp_length(ctx, ls));
    if (sexp_uvector_prefix(et) == 's') {
      min = (-1LL << (sexp_uvector_element_size(et)-1));
      max = (1LL << (sexp_uvector_element_size(et)-1)) - 1LL;
    } else {
      min = 0;
      max = sexp_uvector_element_size(et) == 64 ? -1 :
        (1uLL << sexp_uvector_element_size(et)) - 1LL;
    }
    for (ls2=ls; sexp_pairp(ls2); ls2=sexp_cdr(ls2)) {
      tmp = sexp_car(ls2);
      if (
#if SEXP_USE_UNIFORM_VECTOR_LITERALS
          ((sexp_uvector_prefix(et) == 'u') || (sexp_uvector_prefix(et) == 's')) ?
#endif
          !((min == 0 && sexp_bignump(tmp) ? sexp_bignum_sign(tmp) > 0 : sexp_exact_integerp(tmp) && sexp_sint_value(tmp) >= min)
            && (sexp_sint_value(tmp) < 0 || sexp_uint_value(tmp) <= max))
#if SEXP_USE_UNIFORM_VECTOR_LITERALS
          : ((sexp_uvector_prefix(et) == 'c') ? !sexp_numberp(tmp) :
          !(sexp_exact_integerp(tmp) || sexp_realp(tmp)))
#endif
          ) {
        res = sexp_cons(ctx, SEXP_FALSE, SEXP_FALSE);
        sexp_car(res) = sexp_make_integer(ctx, min);
        sexp_cdr(res) = sexp_make_integer(ctx, max);
        res = sexp_list2(ctx, res, tmp);
        res = sexp_xtype_exception(ctx, self, "invalid uniform vector value", res);
        break;
      }
    }
    if (!sexp_exceptionp(res)) {
      for (i=0; sexp_pairp(ls); ls=sexp_cdr(ls), i++) {
#if SEXP_USE_UNIFORM_VECTOR_LITERALS
        switch (et) {
        case SEXP_U1:
          sexp_bit_set(res, i, sexp_unbox_fixnum(sexp_car(ls))); break;
        case SEXP_S8:
          ((signed char*)sexp_uvector_data(res))[i] = sexp_unbox_fixnum(sexp_car(ls)); break;
        case SEXP_U8:
#endif
          sexp_bytes_set(res, sexp_make_fixnum(i), sexp_car(ls));
#if SEXP_USE_UNIFORM_VECTOR_LITERALS
          break;
        case SEXP_S16:
          ((signed short*)sexp_uvector_data(res))[i] = sexp_unbox_fixnum(sexp_car(ls)); break;
        case SEXP_U16:
          ((unsigned short*)sexp_uvector_data(res))[i] = sexp_unbox_fixnum(sexp_car(ls)); break;
        case SEXP_S32:
          ((int32_t*)sexp_uvector_data(res))[i] = sexp_sint_value(sexp_car(ls)); break;
        case SEXP_U32:
          ((uint32_t*)sexp_uvector_data(res))[i] = sexp_uint_value(sexp_car(ls)); break;
        case SEXP_S64:
          ((int64_t*)sexp_uvector_data(res))[i] = sexp_sint_value(sexp_car(ls)); break;
        case SEXP_U64:
          ((uint64_t*)sexp_uvector_data(res))[i] = sexp_uint_value(sexp_car(ls)); break;
#if SEXP_USE_FLONUMS
#if SEXP_USE_MINI_FLOAT_UNIFORM_VECTORS
        case SEXP_F8:
          ((unsigned char*)sexp_uvector_data(res))[i] = sexp_double_to_quarter(sexp_to_double(ctx, sexp_car(ls))); break;
        case SEXP_F16:
          ((unsigned short*)sexp_uvector_data(res))[i] = sexp_double_to_half(sexp_to_double(ctx, sexp_car(ls))); break;
#endif
        case SEXP_F32:
          ((float*)sexp_uvector_data(res))[i] = sexp_to_double(ctx, sexp_car(ls)); break;
        case SEXP_F64:
          ((double*)sexp_uvector_data(res))[i] = sexp_to_double(ctx, sexp_car(ls)); break;
#endif
#if SEXP_USE_COMPLEX
        case SEXP_C64:
          ((float*)sexp_uvector_data(res))[i*2] =
            sexp_to_double(ctx, sexp_real_part(sexp_car(ls)));
          ((float*)sexp_uvector_data(res))[i*2 + 1] =
            sexp_to_double(ctx, sexp_imag_part(sexp_car(ls)));
          break;
        case SEXP_C128:
          ((double*)sexp_uvector_data(res))[i*2] =
            sexp_to_double(ctx, sexp_real_part(sexp_car(ls)));
          ((double*)sexp_uvector_data(res))[i*2 + 1] =
            sexp_to_double(ctx, sexp_imag_part(sexp_car(ls)));
          break;
#endif
        }
#endif  /* SEXP_USE_UNIFORM_VECTOR_LITERALS */
      }
    }
    sexp_gc_release1(ctx);
  }
  return res;
}